

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

bool __thiscall wallet::SQLiteBatch::ReadKey(SQLiteBatch *this,DataStream *key,DataStream *value)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  DataStream *__n;
  DataStream *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  Span<const_std::byte> SVar4;
  int res;
  Level in_stack_000000a0;
  char (*in_stack_000000b0) [8];
  char **in_stack_000000b8;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  DataStream *in_stack_ffffffffffffff00;
  Span<const_std::byte> *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff18;
  allocator<char> *__a;
  string *local_b0;
  undefined8 in_stack_ffffffffffffff60;
  char *pcVar5;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  bool local_69;
  byte *in_stack_ffffffffffffffa0;
  ConstevalFormatString<2U> in_stack_ffffffffffffffa8;
  string_view in_stack_ffffffffffffffb0;
  string_view in_stack_ffffffffffffffc0;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI->_M_string_length + 200) == 0) {
    local_69 = false;
  }
  else {
    if (*(long *)((long)&in_RDI->field_2 + 8) == 0) {
      __assert_fail("m_read_stmt",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
                    ,0x1cc,"virtual bool wallet::SQLiteBatch::ReadKey(DataStream &&, DataStream &)")
      ;
    }
    __a = *(allocator<char> **)((long)&in_RDI->field_2 + 8);
    Span<const_std::byte>::Span<DataStream>
              (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               (type)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    pcVar5 = &stack0xffffffffffffffc7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RDI,pcVar5,__a);
    SVar4.m_size = (size_t)in_stack_ffffffffffffffa8.fmt;
    SVar4.m_data = in_stack_ffffffffffffffa0;
    bVar2 = BindBlobToStatement((sqlite3_stmt *)
                                CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),iVar3,
                                SVar4,local_b0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      iVar3 = sqlite3_step(*(undefined8 *)((long)&in_RDI->field_2 + 8));
      if (iVar3 == 100) {
        DataStream::clear((DataStream *)
                          CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
        __n = in_RDX;
        SVar4 = SpanFromBlob((sqlite3_stmt *)in_stack_ffffffffffffff18,
                             (int)((ulong)in_stack_ffffffffffffff10 >> 0x20));
        DataStream::write(in_RDX,(int)SVar4.m_data,(void *)SVar4.m_size,(size_t)__n);
        sqlite3_clear_bindings(*(undefined8 *)((long)&in_RDI->field_2 + 8));
        sqlite3_reset(*(undefined8 *)((long)&in_RDI->field_2 + 8));
        local_69 = true;
      }
      else {
        if (iVar3 != 0x65) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
          pcVar5 = "%s: Unable to execute statement: %s\n";
          sqlite3_errstr(iVar3);
          LogPrintFormatInternal<char[8],char_const*>
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0,in_stack_ffffffffffffff6c,
                     (LogFlags)pcVar5,in_stack_000000a0,in_stack_ffffffffffffffa8,in_stack_000000b0,
                     in_stack_000000b8);
        }
        sqlite3_clear_bindings(*(undefined8 *)((long)&in_RDI->field_2 + 8));
        sqlite3_reset(*(undefined8 *)((long)&in_RDI->field_2 + 8));
        local_69 = false;
      }
    }
    else {
      local_69 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_69;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::ReadKey(DataStream&& key, DataStream& value)
{
    if (!m_database.m_db) return false;
    assert(m_read_stmt);

    // Bind: leftmost parameter in statement is index 1
    if (!BindBlobToStatement(m_read_stmt, 1, key, "key")) return false;
    int res = sqlite3_step(m_read_stmt);
    if (res != SQLITE_ROW) {
        if (res != SQLITE_DONE) {
            // SQLITE_DONE means "not found", don't log an error in that case.
            LogPrintf("%s: Unable to execute statement: %s\n", __func__, sqlite3_errstr(res));
        }
        sqlite3_clear_bindings(m_read_stmt);
        sqlite3_reset(m_read_stmt);
        return false;
    }
    // Leftmost column in result is index 0
    value.clear();
    value.write(SpanFromBlob(m_read_stmt, 0));

    sqlite3_clear_bindings(m_read_stmt);
    sqlite3_reset(m_read_stmt);
    return true;
}